

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

void __thiscall ByteCodeGenerator::FuncEscapes(ByteCodeGenerator *this,Scope *scope)

{
  code *pcVar1;
  bool bVar2;
  FuncInfo *pFVar3;
  undefined4 *puVar4;
  Scope *local_18;
  Scope *scope_local;
  ByteCodeGenerator *this_local;
  
  local_18 = scope;
  do {
    if (local_18 == (Scope *)0x0) {
      if ((this->flags & 0x400) != 0) {
        this->funcEscapes = true;
      }
      return;
    }
    pFVar3 = Scope::GetFunc(local_18);
    if (pFVar3 == (FuncInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x11fb,"(scope->GetFunc())","scope->GetFunc()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    pFVar3 = Scope::GetFunc(local_18);
    FuncInfo::SetEscapes(pFVar3,true);
    local_18 = Scope::GetEnclosingScope(local_18);
  } while( true );
}

Assistant:

void ByteCodeGenerator::FuncEscapes(Scope *scope)
{
    while (scope)
    {
        Assert(scope->GetFunc());
        scope->GetFunc()->SetEscapes(true);
        scope = scope->GetEnclosingScope();
    }

    if (this->flags & fscrEval)
    {
        // If a function declared inside eval escapes, we'll need
        // to invalidate the caller's cached scope.
        this->funcEscapes = true;
    }
}